

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O2

void Handler_mode_S_Inventory
               (AInventory *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  char *text;
  bool bVar1;
  undefined8 in_RAX;
  long lVar2;
  FName local_24;
  
  local_24.Index = (int)((ulong)in_RAX >> 0x20);
  text = params[1].s;
  bVar1 = PClass::IsAncestorOf(APowerup::RegistrationInfo.MyClass,&info->super_PClass);
  lVar2 = 0x504;
  if (!bVar1) {
    bVar1 = PClass::IsAncestorOf(APowerupGiver::RegistrationInfo.MyClass,&info->super_PClass);
    lVar2 = 0x510;
    if (!bVar1) {
      I_Error("\"powerup.mode\" requires an actor of type \"Powerup\"\n");
      return;
    }
  }
  FName::FName(&local_24,text);
  *(int *)((long)&(defaults->super_AActor).super_DThinker.super_DObject._vptr_DObject + lVar2) =
       local_24.Index;
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(powerup, mode, S, Inventory)
{
	PROP_STRING_PARM(str, 0);
	FName *pMode;
	if (info->IsDescendantOf(RUNTIME_CLASS(APowerup)))
	{
		pMode = &((APowerup*)defaults)->Mode;
	}
	else if (info->IsDescendantOf(RUNTIME_CLASS(APowerupGiver)))
	{
		pMode = &((APowerupGiver*)defaults)->Mode;
	}
	else
	{
		I_Error("\"powerup.mode\" requires an actor of type \"Powerup\"\n");
		return;
	}
	*pMode = (FName)str;
}